

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O0

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::CloneMap
          (SerializationCloner<Js::StreamWriter> *this,Src src,Dst dst)

{
  bool bVar1;
  uint32 data;
  Engine *pEVar2;
  void **ppvVar3;
  undefined1 local_50 [8];
  KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> local_48;
  MapDataKeyValuePair *entry;
  Iterator iter;
  JavascriptMap *map;
  Dst dst_local;
  Src src_local;
  SerializationCloner<Js::StreamWriter> *this_local;
  
  iter.current.ptr =
       (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
        *)VarTo<Js::JavascriptMap>(src);
  data = JavascriptMap::Size((JavascriptMap *)iter.current.ptr);
  Write(this,data);
  JavascriptMap::GetIterator((JavascriptMap *)&entry);
  while( true ) {
    bVar1 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
            ::Iterator::Next((Iterator *)&entry);
    if (!bVar1) break;
    local_48.value.ptr =
         MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
         ::Iterator::Current((Iterator *)&entry);
    pEVar2 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
             ::GetEngine(&this->
                          super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                        );
    JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::Key
              ((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
               (local_50 + 8));
    ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)(local_50 + 8));
    SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
              (pEVar2,*ppvVar3);
    pEVar2 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
             ::GetEngine(&this->
                          super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                        );
    JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::Value
              ((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
               local_50);
    ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)local_50);
    SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
              (pEVar2,*ppvVar3);
  }
  return;
}

Assistant:

void SerializationCloner<Writer>::CloneMap(Src src, Dst dst)
    {
        JavascriptMap* map = VarTo<JavascriptMap>(src);

        Write((int32)(map->Size()));

        JavascriptMap::MapDataList::Iterator iter = map->GetIterator();
        while (iter.Next())
        {
            const JavascriptMap::MapDataKeyValuePair& entry = iter.Current();
            this->GetEngine()->Clone(entry.Key());
            this->GetEngine()->Clone(entry.Value());
        }
    }